

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteDatabase::Backup(SQLiteDatabase *this,string *dest)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *local_28;
  sqlite3 *db_copy;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_open((dest->_M_dataplus)._M_p,&db_copy);
  if (iVar1 == 0) {
    lVar2 = sqlite3_backup_init(db_copy,"main",this->m_db);
    if (lVar2 == 0) {
      local_28 = (char *)sqlite3_errmsg(this->m_db);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x61;
      logging_function._M_str = "Backup";
      logging_function._M_len = 6;
      LogPrintFormatInternal<char[7],char_const*>
                (logging_function,source_file,0x164,ALL,Info,(ConstevalFormatString<2U>)0xe0c533,
                 (char (*) [7])"Backup",&local_28);
    }
    else {
      iVar1 = sqlite3_backup_step(lVar2,0xffffffffffffffff);
      if (iVar1 == 0x65) {
        iVar1 = sqlite3_backup_finish(lVar2);
        sqlite3_close(db_copy);
        bVar3 = iVar1 == 0;
        goto LAB_009c8d30;
      }
      local_28 = (char *)sqlite3_errstr(iVar1);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file_00._M_len = 0x61;
      logging_function_00._M_str = "Backup";
      logging_function_00._M_len = 6;
      LogPrintFormatInternal<char[7],char_const*>
                (logging_function_00,source_file_00,0x16b,ALL,Info,
                 (ConstevalFormatString<2U>)0xe0c553,(char (*) [7])"Backup",&local_28);
      sqlite3_backup_finish(lVar2);
    }
  }
  sqlite3_close(db_copy);
  bVar3 = false;
LAB_009c8d30:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool SQLiteDatabase::Backup(const std::string& dest) const
{
    sqlite3* db_copy;
    int res = sqlite3_open(dest.c_str(), &db_copy);
    if (res != SQLITE_OK) {
        sqlite3_close(db_copy);
        return false;
    }
    sqlite3_backup* backup = sqlite3_backup_init(db_copy, "main", m_db, "main");
    if (!backup) {
        LogPrintf("%s: Unable to begin backup: %s\n", __func__, sqlite3_errmsg(m_db));
        sqlite3_close(db_copy);
        return false;
    }
    // Specifying -1 will copy all of the pages
    res = sqlite3_backup_step(backup, -1);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to backup: %s\n", __func__, sqlite3_errstr(res));
        sqlite3_backup_finish(backup);
        sqlite3_close(db_copy);
        return false;
    }
    res = sqlite3_backup_finish(backup);
    sqlite3_close(db_copy);
    return res == SQLITE_OK;
}